

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process_Unix::CreatePipe(Process_Unix *this,int *filedes)

{
  int iVar1;
  ILogger *this_00;
  char *arguments_2;
  string local_38;
  
  iVar1 = pipe(filedes);
  if (iVar1 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Process_Unix","");
    this_00 = gnilk::Logger::GetLogger(&local_38);
    arguments_2 = strerror(-1);
    gnilk::Log::Error<char_const*,int,char*>(this_00,"stdout pipe %d, %s",-1,arguments_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar1 != -1;
}

Assistant:

bool Process_Unix::CreatePipe(int *filedes) {
	int status = pipe(filedes);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("stdout pipe %d, %s", status, strerror(status));
		return false;
	}
	return true;
}